

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall Buffer_change_event_coalesce_Test::TestBody(Buffer_change_event_coalesce_Test *this)

{
  void *pvVar1;
  char *pcVar2;
  long lVar3;
  initializer_list<bfy_changed_cb_info> __l;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  BufferWithReadonlyStrings local;
  allocator_type local_139;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  pointer local_128;
  AssertHelper local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  bfy_changed_cb_info local_110;
  size_t local_f8;
  BufferWithReadonlyStrings local_f0;
  
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_f0);
  local_f8 = bfy_buffer_get_content_len(&local_f0.buf);
  bfy_buffer_set_changed_cb
            (&local_f0.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_f0.changes);
  bfy_buffer_begin_coalescing_change_events(&local_f0.buf);
  lVar3 = 0x400;
  do {
    local_110.orig_size = local_110.orig_size & 0xffffffff00000000;
    local_120.data_._0_4_ = bfy_buffer_add_readonly(&local_f0.buf,"Lorem ipsum dolor sit amet",0x1a)
    ;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_138,"0",
               "bfy_buffer_add_readonly(&local.buf, std::data(str), std::size(str))",
               (int *)&local_110,(int *)&local_120);
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      pcVar2 = "";
      if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = (local_130->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x656,pcVar2);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if ((long *)local_110.orig_size != (long *)0x0) {
        (**(code **)(*(long *)local_110.orig_size + 8))();
      }
    }
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,local_130);
    }
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  bfy_buffer_end_coalescing_change_events(&local_f0.buf);
  local_110.orig_size = local_f8;
  local_110.n_added = 0x6800;
  local_110.n_deleted = 0;
  __l._M_len = 1;
  __l._M_array = &local_110;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_138,__l,
             &local_139);
  testing::internal::
  CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
            ((internal *)&local_120,"changes_t{expected}","local.changes",
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_138,
             &local_f0.changes);
  pvVar1 = (void *)CONCAT71(local_138._1_7_,local_138[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_128 - (long)pvVar1);
  }
  if (local_120.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if (local_118 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_118->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x659,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
    }
  }
  if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_118,local_118);
  }
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_f0);
  return;
}

Assistant:

TEST(Buffer, change_event_coalesce) {
    BufferWithReadonlyStrings local;
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto constexpr n = 1024;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = std::size(str) * n,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    bfy_buffer_begin_coalescing_change_events(&local.buf);
    for (size_t i=0; i<1024; ++i) {
        EXPECT_EQ(0, bfy_buffer_add_readonly(&local.buf, std::data(str), std::size(str)));
    }
    bfy_buffer_end_coalescing_change_events(&local.buf);
    EXPECT_EQ(changes_t{expected}, local.changes);
}